

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O2

void __thiscall inequation_True1_Test::TestBody(inequation_True1_Test *this)

{
  ExprPtr *ex;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  string local_40;
  ExprPtr e;
  
  mathiu::impl::operator____s((char *)&local_40,0x1ccabb);
  mathiu::impl::operator____s(&gtest_ar.success_,0x1ccabb);
  mathiu::impl::operator==((impl *)&e,(ExprPtr *)&local_40,(ExprPtr *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  mathiu::impl::toString_abi_cxx11_(&local_40,(impl *)&e,ex);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&gtest_ar,"toString(e)","\"true\"",&local_40,(char (*) [5])"true");
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0x15,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(inequation, True1)
{
    auto const e = "x"_s == "x"_s;
    EXPECT_EQ(toString(e), "true");
}